

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  void *__src;
  long lVar5;
  size_t __n;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  uchar *puVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int local_d4;
  ulong uStack_d0;
  int zlen;
  ulong local_c8;
  int *local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  int *local_98;
  uchar *local_90;
  ulong local_88;
  size_t local_80;
  long local_78;
  undefined4 local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uchar *local_60;
  long local_58;
  ulong local_50;
  uchar *local_48;
  int local_40;
  undefined4 local_3c;
  uint local_38;
  uint local_34;
  
  uVar18 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar18;
  }
  iVar19 = (uVar18 + 1) * y;
  local_98 = out_len;
  local_68 = x;
  local_38 = n;
  local_34 = y;
  local_48 = (uchar *)malloc((long)iVar19);
  if (local_48 != (uchar *)0x0) {
    local_80 = (size_t)(int)uVar18;
    local_64 = iVar19;
    local_50 = (ulong)uVar18;
    __src = malloc(local_80);
    if (__src == (void *)0x0) {
      free(local_48);
    }
    else {
      lVar5 = (long)(int)local_38;
      local_78 = lVar5;
      if (0 < (int)local_34) {
        local_b0 = (long)stride_bytes;
        local_a8 = (long)(int)(uVar18 + 1);
        local_a0 = (ulong)local_34;
        uVar10 = (ulong)local_38;
        local_b8 = local_50 & 0xffffffff;
        lVar21 = (long)pixels - local_b0;
        puVar14 = pixels + lVar5;
        puVar9 = pixels + (lVar5 - local_b0);
        local_58 = local_80 - lVar5;
        uVar7 = 0;
        uStack_d0 = uVar10;
        do {
          local_c0 = stbi_write_png_to_mem::mapping;
          if (uVar7 == 0) {
            local_c0 = stbi_write_png_to_mem::firstmap;
          }
          iVar19 = 0x7fffffff;
          uVar18 = 0;
          piVar15 = (int *)CONCAT71((int7)((ulong)out_len >> 8),1);
          do {
            uVar12 = (ulong)uVar18;
            uVar3 = uVar18;
            if ((char)piVar15 != '\0') {
              uVar3 = 0;
            }
            out_len = piVar15;
            if ((int)uVar3 < 5) {
              local_70 = SUB84(piVar15,0);
              uVar16 = (long)(int)uVar3;
              do {
                local_40 = iVar19;
                local_c8 = uVar16;
                local_3c = (undefined4)uVar12;
                iVar19 = local_c0[local_c8];
                if (0 < (int)local_38) {
                  uVar16 = 0;
                  do {
                    switch(iVar19) {
                    case 0:
                    case 1:
                    case 5:
                    case 6:
                      uVar2 = pixels[uVar16];
                      break;
                    case 2:
                    case 4:
                      uVar2 = pixels[uVar16] - *(char *)(lVar21 + uVar16);
                      break;
                    case 3:
                      uVar2 = pixels[uVar16] - (*(byte *)(lVar21 + uVar16) >> 1);
                      break;
                    default:
                      goto switchD_00107033_default;
                    }
                    *(uchar *)((long)__src + uVar16) = uVar2;
switchD_00107033_default:
                    uVar16 = uVar16 + 1;
                  } while (uVar10 != uVar16);
                }
                if ((int)local_38 < (int)local_50) {
                  lVar17 = 0;
                  do {
                    switch(iVar19) {
                    case 0:
                      uVar2 = puVar14[lVar17];
                      break;
                    case 1:
                    case 6:
                      uVar2 = puVar14[lVar17] - pixels[lVar17];
                      break;
                    case 2:
                      uVar2 = puVar14[lVar17] - puVar9[lVar17];
                      break;
                    case 3:
                      uVar2 = puVar14[lVar17] -
                              (char)((uint)puVar9[lVar17] + (uint)pixels[lVar17] >> 1);
                      break;
                    case 4:
                      bVar11 = pixels[lVar17];
                      bVar1 = puVar9[lVar17];
                      bVar6 = *(byte *)(lVar21 + lVar17);
                      iVar4 = ((uint)bVar1 + (uint)bVar11) - (uint)bVar6;
                      uVar8 = iVar4 - (uint)bVar11;
                      uVar3 = -uVar8;
                      if (0 < (int)uVar8) {
                        uVar3 = uVar8;
                      }
                      uVar20 = iVar4 - (uint)bVar1;
                      uVar8 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar8 = uVar20;
                      }
                      uVar13 = iVar4 - (uint)bVar6;
                      uVar20 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar20 = uVar13;
                      }
                      if (uVar8 <= uVar20) {
                        bVar6 = bVar1;
                      }
                      if (uVar20 < uVar3) {
                        bVar11 = bVar6;
                      }
                      if (uVar8 < uVar3) {
                        bVar11 = bVar6;
                      }
                      uVar2 = puVar14[lVar17] - bVar11;
                      uVar10 = uStack_d0;
                      break;
                    case 5:
                      uVar2 = puVar14[lVar17] - (pixels[lVar17] >> 1);
                      break;
                    default:
                      goto switchD_00107094_default;
                    }
                    *(uchar *)((long)__src + lVar17 + lVar5) = uVar2;
switchD_00107094_default:
                    lVar17 = lVar17 + 1;
                  } while (local_58 != lVar17);
                }
                out_len = (int *)((ulong)piVar15 & 0xffffffff);
                local_6c = uVar18;
                if (((ulong)piVar15 & 1) == 0) {
                  uVar12 = (ulong)uVar18;
                  goto LAB_00107208;
                }
                if ((int)local_50 < 1) {
                  iVar4 = 0;
                }
                else {
                  uVar16 = 0;
                  iVar4 = 0;
                  do {
                    bVar11 = (char)*(byte *)((long)__src + uVar16) >> 7;
                    iVar4 = iVar4 + (uint)(byte)((*(byte *)((long)__src + uVar16) ^ bVar11) - bVar11
                                                );
                    uVar16 = uVar16 + 1;
                  } while (local_b8 != uVar16);
                }
                iVar19 = local_40;
                if (iVar4 < local_40) {
                  uVar12 = local_c8 & 0xffffffff;
                  iVar19 = iVar4;
                }
                uVar16 = local_c8 + 1;
              } while ((int)(local_c8 + 1) != 5);
            }
            uVar18 = (uint)uVar12;
            uVar16 = (ulong)out_len & 1;
            out_len = (int *)0x0;
            piVar15 = out_len;
          } while (uVar16 != 0);
LAB_00107208:
          local_48[uVar7 * local_a8] = (uchar)uVar12;
          local_90 = puVar14;
          local_88 = uVar7;
          local_60 = puVar9;
          memcpy(local_48 + uVar7 * local_a8 + 1,__src,local_80);
          uVar7 = local_88 + 1;
          lVar21 = lVar21 + local_b0;
          pixels = pixels + local_b0;
          puVar14 = local_90 + local_b0;
          puVar9 = local_60 + local_b0;
        } while (uVar7 != local_a0);
      }
      free(__src);
      puVar14 = local_48;
      puVar9 = stbi_zlib_compress(local_48,local_64,&local_d4,8);
      free(puVar14);
      __n = (size_t)local_d4;
      puVar14 = (uchar *)malloc(__n + 0x39);
      piVar15 = local_98;
      if (puVar14 != (uchar *)0x0) {
        *local_98 = (int)(__n + 0x39);
        puVar14[0] = 0x89;
        puVar14[1] = 'P';
        puVar14[2] = 'N';
        puVar14[3] = 'G';
        puVar14[4] = '\r';
        puVar14[5] = '\n';
        puVar14[6] = '\x1a';
        puVar14[7] = '\n';
        puVar14[8] = '\0';
        puVar14[9] = '\0';
        puVar14[10] = '\0';
        puVar14[0xb] = '\r';
        puVar14[0xc] = 'I';
        puVar14[0xd] = 'H';
        puVar14[0xe] = 'D';
        puVar14[0xf] = 'R';
        puVar14[0x10] = (uchar)((uint)local_68 >> 0x18);
        puVar14[0x11] = (uchar)((uint)local_68 >> 0x10);
        puVar14[0x12] = (uchar)((uint)local_68 >> 8);
        puVar14[0x13] = (uchar)local_68;
        puVar14[0x14] = (uchar)(local_34 >> 0x18);
        puVar14[0x15] = (uchar)(local_34 >> 0x10);
        puVar14[0x16] = (uchar)(local_34 >> 8);
        puVar14[0x17] = (uchar)local_34;
        puVar14[0x18] = '\b';
        puVar14[0x19] = (&DAT_0016f160)[local_78 * 4];
        puVar14[0x1a] = '\0';
        puVar14[0x1b] = '\0';
        puVar14[0x1c] = '\0';
        uVar18 = stbiw__crc32(puVar14 + 0xc,0x11);
        puVar14[0x1d] = (uchar)(uVar18 >> 0x18);
        puVar14[0x1e] = (uchar)(uVar18 >> 0x10);
        puVar14[0x1f] = (uchar)(uVar18 >> 8);
        puVar14[0x20] = (uchar)uVar18;
        puVar14[0x21] = (uchar)((uint)local_d4 >> 0x18);
        puVar14[0x22] = (uchar)((uint)local_d4 >> 0x10);
        puVar14[0x23] = (uchar)((uint)local_d4 >> 8);
        puVar14[0x24] = (uchar)local_d4;
        puVar14[0x25] = 'I';
        puVar14[0x26] = 'D';
        puVar14[0x27] = 'A';
        puVar14[0x28] = 'T';
        memmove(puVar14 + 0x29,puVar9,__n);
        free(puVar9);
        uVar18 = stbiw__crc32(puVar14 + 0x25,local_d4 + 4);
        puVar14[__n + 0x29] = (uchar)(uVar18 >> 0x18);
        puVar14[__n + 0x2a] = (uchar)(uVar18 >> 0x10);
        puVar14[__n + 0x2b] = (uchar)(uVar18 >> 8);
        puVar14[__n + 0x2c] = (uchar)uVar18;
        puVar9 = puVar14 + __n + 0x2d;
        puVar9[0] = '\0';
        puVar9[1] = '\0';
        puVar9[2] = '\0';
        puVar9[3] = '\0';
        puVar9[4] = 'I';
        puVar9[5] = 'E';
        puVar9[6] = 'N';
        puVar9[7] = 'D';
        uVar18 = stbiw__crc32(puVar14 + __n + 0x31,4);
        *(uint *)(puVar14 + __n + 0x35) =
             uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
        if (puVar14 + __n + 0x39 == puVar14 + *piVar15) {
          return puVar14;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                      ,0x2b3,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = (unsigned char) ctype[n];
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}